

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

string * __thiscall ByteString::hex_str_abi_cxx11_(ByteString *this)

{
  size_type sVar1;
  byte *pbVar2;
  long in_RSI;
  string *in_RDI;
  size_t i;
  char hex [3];
  string *rv;
  ulong local_20;
  char local_14 [3];
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string(in_RDI);
  for (local_20 = 0;
      sVar1 = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RSI + 8)),
      local_20 < sVar1; local_20 = local_20 + 1) {
    pbVar2 = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RSI + 8),
                        local_20);
    snprintf(local_14,3,"%02X",(ulong)*pbVar2);
    std::__cxx11::string::operator+=(in_RDI,local_14);
  }
  return in_RDI;
}

Assistant:

std::string ByteString::hex_str() const
{
	std::string rv;
	char hex[3];

	for (size_t i = 0; i < byteString.size(); i++)
	{
		snprintf(hex, sizeof(hex), "%02X", byteString[i]);
		rv += hex;
	}

	return rv;
}